

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resourcefile.cpp
# Opt level: O3

int __thiscall
FResourceFile::FilterLumps
          (FResourceFile *this,FString *filtername,void *lumps,size_t lumpsize,DWORD max)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  FString *pFVar4;
  ulong uVar5;
  FResourceFile *pFVar6;
  uint uVar7;
  undefined8 *pos;
  uint uVar8;
  void *__dest;
  FString filter;
  DWORD end;
  DWORD start;
  FString local_60;
  void *local_58;
  FResourceFile *local_50;
  uint local_48;
  uint local_44;
  FString local_40;
  FString local_38;
  
  FString::NullString.RefCount = FString::NullString.RefCount + 1;
  local_60.Chars = FString::NullString.Nothing;
  if (*(int *)(filtername->Chars + -0xc) == 0) {
    uVar7 = 0;
  }
  else {
    local_50 = this;
    pFVar4 = FString::operator+=(&local_60,"filter/");
    pFVar4 = FString::operator+=(pFVar4,filtername);
    FString::operator+=(pFVar4,'/');
    pFVar6 = (FResourceFile *)&local_38;
    FString::AttachToOther((FString *)pFVar6,&local_60);
    bVar2 = FindPrefixRange(pFVar6,&local_38,lumps,lumpsize,max,&local_44,&local_48);
    FString::~FString(&local_38);
    uVar5 = (ulong)local_44;
    if (bVar2) {
      local_58 = (void *)(uVar5 * lumpsize);
      uVar8 = local_48;
      if (local_44 < local_48) {
        pos = (undefined8 *)((long)lumps + (long)local_58 + 0x10);
        do {
          uVar7 = ((FNullStringData *)(local_60.Chars + -0xc))->Len;
          iVar3 = strncasecmp((char *)*pos,local_60.Chars,(long)(int)uVar7);
          if (iVar3 != 0) {
            __assert_fail("lump->FullName.CompareNoCase(filter, (int)filter.Len()) == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/resourcefiles/resourcefile.cpp"
                          ,0x188,"int FResourceFile::FilterLumps(FString, void *, size_t, DWORD)");
          }
          FString::Mid(&local_40,(size_t)pos,(ulong)uVar7);
          FResourceLump::LumpNameSetup((FResourceLump *)(pos + -2),&local_40);
          FString::~FString(&local_40);
          uVar7 = (int)uVar5 + 1;
          uVar5 = (ulong)uVar7;
          pos = (undefined8 *)((long)pos + lumpsize);
          uVar8 = local_48;
        } while (uVar7 < local_48);
      }
      local_58 = (void *)((long)local_58 + (long)lumps);
      uVar7 = uVar8 - local_44;
      uVar5 = uVar7 * lumpsize;
      uVar1 = local_50->NumLumps;
      __dest = (void *)((long)lumps + (uVar1 * lumpsize - uVar5));
      if (__dest < local_58) {
        __assert_fail("to >= from",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/resourcefiles/resourcefile.cpp"
                      ,399,"int FResourceFile::FilterLumps(FString, void *, size_t, DWORD)");
      }
      if (__dest != local_58) {
        local_50 = (FResourceFile *)operator_new__(uVar5);
        memcpy(local_50,local_58,uVar5);
        memmove(local_58,(void *)((long)local_58 + uVar5),(uVar1 - uVar8) * lumpsize);
        pFVar6 = local_50;
        memcpy(__dest,local_50,uVar5);
        operator_delete__(pFVar6);
      }
    }
    else {
      uVar7 = local_48 - local_44;
    }
  }
  FString::~FString(&local_60);
  return uVar7;
}

Assistant:

int FResourceFile::FilterLumps(FString filtername, void *lumps, size_t lumpsize, DWORD max)
{
	FString filter;
	DWORD start, end;

	if (filtername.IsEmpty())
	{
		return 0;
	}
	filter << "filter/" << filtername << '/';
	if (FindPrefixRange(filter, lumps, lumpsize, max, start, end))
	{
		void *from = (BYTE *)lumps + start * lumpsize;

		// Remove filter prefix from every name
		void *lump_p = from;
		for (DWORD i = start; i < end; ++i, lump_p = (BYTE *)lump_p + lumpsize)
		{
			FResourceLump *lump = (FResourceLump *)lump_p;
			assert(lump->FullName.CompareNoCase(filter, (int)filter.Len()) == 0);
			lump->LumpNameSetup(lump->FullName.Mid(filter.Len()));
		}

		// Move filtered lumps to the end of the lump list.
		size_t count = (end - start) * lumpsize;
		void *to = (BYTE *)lumps + NumLumps * lumpsize - count;
		assert (to >= from);

		if (from != to)
		{
			// Copy filtered lumps to a temporary buffer.
			BYTE *filteredlumps = new BYTE[count];
			memcpy(filteredlumps, from, count);

			// Shift lumps left to make room for the filtered ones at the end.
			memmove(from, (BYTE *)from + count, (NumLumps - end) * lumpsize);

			// Copy temporary buffer to newly freed space.
			memcpy(to, filteredlumps, count);

			delete[] filteredlumps;
		}
	}
	return end - start;
}